

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::gs(AbstractContentContext *this,string *inGraphicStateName)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *inGraphicStateName_local;
  AbstractContentContext *this_local;
  
  local_18 = inGraphicStateName;
  inGraphicStateName_local = (string *)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,local_18,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"gs",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::gs(const std::string& inGraphicStateName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteName(inGraphicStateName);
	mPrimitiveWriter.WriteKeyword("gs");
	return GetCurrentStatusCode();
}